

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintBundle.h
# Opt level: O3

void __thiscall PrintBundle::LoadLayerSettings(PrintBundle *this)

{
  undefined8 *puVar1;
  pointer pcVar2;
  _Map_pointer ppLVar3;
  uint __val;
  pointer pbVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  istream *piVar9;
  long lVar10;
  undefined8 *puVar11;
  long *plVar12;
  ulong uVar13;
  ulong *puVar14;
  uint __len;
  uint uVar15;
  string OneAttribute;
  string __str_1;
  Layer L;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rowData;
  string line;
  ifstream LayerInfoFile;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  value_type local_338;
  ulong *local_318;
  long local_310;
  ulong local_308 [2];
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8 [2];
  undefined1 local_2d8 [16];
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  value_type local_268;
  queue<Layer,_std::deque<Layer,_std::allocator<Layer>_>_> *local_248;
  PrintBundle *local_240;
  long local_238 [65];
  
  std::ifstream::ifstream(local_238);
  local_2a8[0] = local_298;
  pcVar2 = (this->Folder)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,pcVar2,pcVar2 + (this->Folder)._M_string_length);
  std::__cxx11::string::append((char *)local_2a8);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)local_2a8[0]);
  this->numLayers = 0;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unable to read in Settings file. Check again",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    cVar6 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_238,(string *)&local_268,cVar6);
    local_248 = &this->Layers;
    local_240 = this;
    while( true ) {
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_268,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c0 = 0;
      local_2b8._M_local_buf[0] = '\0';
      local_2d8._0_4_ = 0;
      local_2d8._4_4_ = 0;
      local_2d8._12_4_ = 0;
      local_2c8._M_p = (pointer)&local_2b8;
      while (local_268._M_string_length != 0) {
        cVar6 = (char)&local_268;
        lVar10 = std::__cxx11::string::find(cVar6,0x2c);
        if (lVar10 == -1) break;
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        local_338._M_string_length = 0;
        local_338.field_2._M_allocated_capacity =
             local_338.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::__cxx11::string::find(cVar6,0x2c);
        std::__cxx11::string::substr((ulong)&local_358,(ulong)&local_268);
        std::__cxx11::string::operator=((string *)&local_338,(string *)&local_358);
        if (local_358 != &local_348) {
          operator_delete(local_358);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_288,&local_338);
        std::__cxx11::string::erase((ulong)&local_268,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_288,&local_268);
      pbVar4 = local_288.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = atoi(((local_288.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
      local_2d8._0_4_ = iVar7;
      iVar7 = atoi(pbVar4[1]._M_dataplus._M_p);
      local_2d8._4_4_ = iVar7;
      local_2d8._8_4_ = atoi(pbVar4[2]._M_dataplus._M_p);
      local_2d8._12_4_ = atoi(pbVar4[3]._M_dataplus._M_p);
      local_318 = local_308;
      pcVar2 = (this->Folder)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_318,pcVar2,pcVar2 + (this->Folder)._M_string_length);
      std::__cxx11::string::append((char *)&local_318);
      uVar15 = this->numLayers + 1;
      __val = -uVar15;
      if (0 < (int)uVar15) {
        __val = uVar15;
      }
      __len = 1;
      if (9 < __val) {
        uVar13 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar8 = (uint)uVar13;
          if (uVar8 < 100) {
            __len = __len - 2;
            goto LAB_00105399;
          }
          if (uVar8 < 1000) {
            __len = __len - 1;
            goto LAB_00105399;
          }
          if (uVar8 < 10000) goto LAB_00105399;
          uVar13 = uVar13 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar8);
        __len = __len + 1;
      }
LAB_00105399:
      local_2f8 = local_2e8;
      std::__cxx11::string::_M_construct
                ((ulong)&local_2f8,(char)__len - (char)((int)uVar15 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar15 >> 0x1f) + (long)local_2f8),__len,__val);
      this = local_240;
      uVar13 = 0xf;
      if (local_318 != local_308) {
        uVar13 = local_308[0];
      }
      if (uVar13 < (ulong)(local_2f0 + local_310)) {
        uVar13 = 0xf;
        if (local_2f8 != local_2e8) {
          uVar13 = local_2e8[0];
        }
        if (uVar13 < (ulong)(local_2f0 + local_310)) goto LAB_00105428;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_2f8,0,(char *)0x0,(ulong)local_318);
      }
      else {
LAB_00105428:
        puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2f8)
        ;
      }
      puVar1 = puVar11 + 2;
      if ((undefined8 *)*puVar11 == puVar1) {
        local_348 = *puVar1;
        uStack_340 = puVar11[3];
        local_358 = &local_348;
      }
      else {
        local_348 = *puVar1;
        local_358 = (undefined8 *)*puVar11;
      }
      local_350 = puVar11[1];
      *puVar11 = puVar1;
      puVar11[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_358);
      puVar14 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_338.field_2._M_allocated_capacity = *puVar14;
        local_338.field_2._8_8_ = plVar12[3];
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      }
      else {
        local_338.field_2._M_allocated_capacity = *puVar14;
        local_338._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_338._M_string_length = plVar12[1];
      *plVar12 = (long)puVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_338);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358);
      }
      if (local_2f8 != local_2e8) {
        operator_delete(local_2f8);
      }
      if (local_318 != local_308) {
        operator_delete(local_318);
      }
      std::deque<Layer,_std::allocator<Layer>_>::push_back(&local_248->c,(value_type *)local_2d8);
      this->numLayers = this->numLayers + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_p != &local_2b8) {
        operator_delete(local_2c8._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_288);
    }
  }
  ppLVar3 = (this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  this->numLayers =
       (int)((ulong)((long)(this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl
                           .super__Deque_impl_data._M_start._M_last -
                    (long)(this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur) >> 4) * -0x55555555 +
       (int)((ulong)((long)(this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl
                           .super__Deque_impl_data._M_finish._M_cur -
                    (long)(this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first) >> 4) * -0x55555555 +
       ((int)((ulong)((long)ppLVar3 -
                     (long)(this->Layers).c.super__Deque_base<Layer,_std::allocator<Layer>_>._M_impl
                           .super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
       (uint)(ppLVar3 == (_Map_pointer)0x0)) * 10;
  std::ifstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_2a8[0] != local_298) {
    operator_delete(local_2a8[0]);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void PrintBundle::LoadLayerSettings()
{
	ifstream LayerInfoFile;
	string file = Folder + "/layersettings.csv";
	LayerInfoFile.open(file.c_str());
	
	numLayers = 0;
	string line;
	if (LayerInfoFile.is_open())
	{
		//Get rid of the first row
		getline(LayerInfoFile, line);

		//Parse remaining rows
		while(getline(LayerInfoFile, line))
		{
			vector <string> rowData;
			Layer L;

			while(line.length() != 0 && line.find(',') != string::npos)
			{
				size_t pos;
				string OneAttribute;
				pos = line.find_first_of(',');
				OneAttribute = line.substr(0, pos);
				rowData.push_back(OneAttribute);
				line.erase(0, pos+1);

			}
			rowData.push_back(line);

			L.index = atoi(rowData[0].c_str());
			L.FirstApproachWait = atoi(rowData[1].c_str());
			L.BurnInApproachWait = atoi(rowData[2].c_str());
			L.ModelApproachWait = atoi(rowData[3].c_str());
			L.imageLoc = Folder + "/slice_" + to_string(numLayers+1) + ".png";
			
			Layers.push(L);
			numLayers++;

		}
		
	}

	else
		cout << "Unable to read in Settings file. Check again" << endl;

	numLayers = Layers.size();

	LayerInfoFile.close();

}